

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> * __thiscall
kj::ArrayBuilder<kj::ArrayPtr<const_capnp::word>_>::operator=
          (ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> *this,
          ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> *other)

{
  ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> *other_local;
  ArrayBuilder<kj::ArrayPtr<const_capnp::word>_> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (ArrayPtr<const_capnp::word> *)0x0;
  other->pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
  other->endPtr = (ArrayPtr<const_capnp::word> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }